

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_PointerTuple.cpp
# Opt level: O0

Type_PointerTuple * __thiscall
Type_PointerTuple::operator=(Type_PointerTuple *this,Type_PointerTuple *o)

{
  Type_PointerTuple *in_RSI;
  Type_PointerTuple *in_RDI;
  
  if (in_RDI != in_RSI) {
    Type::operator=(&in_RDI->super_Type,&in_RSI->super_Type);
    in_RDI->_m_pred = in_RSI->_m_pred;
    in_RDI->_m_aI = in_RSI->_m_aI;
    in_RDI->_m_oI = in_RSI->_m_oI;
  }
  return in_RDI;
}

Assistant:

Type_PointerTuple& Type_PointerTuple::operator= (const Type_PointerTuple& o)
{
    if (this == &o) return *this;   // Gracefully handle self assignment
    // Put the normal assignment duties here...
    Type::operator=(o);
    _m_pred = o._m_pred;
    _m_aI = o._m_aI;
    _m_oI = o._m_oI;
    return *this;
}